

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_wav_init_file_w(wchar_t *pFilePath,ma_decoding_backend_config *pConfig,
                            ma_allocation_callbacks *pAllocationCallbacks,ma_wav *pWav)

{
  ma_result mVar1;
  ma_bool32 mVar2;
  
  mVar1 = ma_wav_init_internal(pConfig,pWav);
  if (mVar1 == MA_SUCCESS) {
    mVar2 = ma_dr_wav_init_file_w(&pWav->dr,pFilePath,pAllocationCallbacks);
    if (mVar2 == 1) {
      ma_wav_post_init(pWav);
      mVar1 = MA_SUCCESS;
    }
    else {
      mVar1 = MA_INVALID_FILE;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_wav_init_file_w(const wchar_t* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_wav* pWav)
{
    ma_result result;

    result = ma_wav_init_internal(pConfig, pWav);
    if (result != MA_SUCCESS) {
        return result;
    }

    #if !defined(MA_NO_WAV)
    {
        ma_bool32 wavResult;

        wavResult = ma_dr_wav_init_file_w(&pWav->dr, pFilePath, pAllocationCallbacks);
        if (wavResult != MA_TRUE) {
            return MA_INVALID_FILE;
        }

        ma_wav_post_init(pWav);

        return MA_SUCCESS;
    }
    #else
    {
        /* wav is disabled. */
        (void)pFilePath;
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}